

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_skey.cc
# Opt level: O2

void * s2i_skey_id(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,char *str)

{
  int *piVar1;
  void *data;
  int iVar2;
  ASN1_OCTET_STRING *pAVar3;
  X509 *pXVar4;
  EVP_MD *type;
  X509V3_CTX *ctx_00;
  X509V3_EXT_METHOD *method_00;
  long lStack_70;
  uint diglen;
  uchar pkey_dig [64];
  
  ctx_00 = (X509V3_CTX *)0x318d10;
  method_00 = (X509V3_EXT_METHOD *)str;
  iVar2 = strcmp(str,"hash");
  if (iVar2 != 0) {
    pAVar3 = s2i_ASN1_OCTET_STRING(method_00,ctx_00,str);
    return pAVar3;
  }
  pAVar3 = ASN1_OCTET_STRING_new();
  if (pAVar3 == (ASN1_OCTET_STRING *)0x0) {
    return (void *)0x0;
  }
  iVar2 = 0x56;
  if (ctx != (X509V3_CTX *)0x0) {
    if (ctx->flags == 1) {
      return pAVar3;
    }
    pXVar4 = (X509 *)ctx->subject_req;
    if (pXVar4 == (X509 *)0x0) {
      pXVar4 = ctx->subject_cert;
      if (pXVar4 == (X509 *)0x0) goto LAB_002d8d15;
      lStack_70 = 0x30;
    }
    else {
      lStack_70 = 0x28;
    }
    piVar1 = *(int **)(*(long *)((long)&((ASN1_ENCODING *)&pXVar4->cert_info->version)->enc +
                                lStack_70) + 8);
    if (piVar1 != (int *)0x0) {
      data = *(void **)(piVar1 + 2);
      iVar2 = *piVar1;
      type = EVP_sha1();
      iVar2 = EVP_Digest(data,(long)iVar2,pkey_dig,&diglen,type,(ENGINE *)0x0);
      if ((iVar2 != 0) && (iVar2 = ASN1_OCTET_STRING_set(pAVar3,pkey_dig,diglen), iVar2 != 0)) {
        return pAVar3;
      }
      goto LAB_002d8d2b;
    }
    iVar2 = 0x61;
  }
LAB_002d8d15:
  ERR_put_error(0x14,0,0x90,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_skey.cc"
                ,iVar2);
LAB_002d8d2b:
  ASN1_OCTET_STRING_free(pAVar3);
  return (void *)0x0;
}

Assistant:

static void *s2i_skey_id(const X509V3_EXT_METHOD *method, const X509V3_CTX *ctx,
                         const char *str) {
  ASN1_OCTET_STRING *oct;
  ASN1_BIT_STRING *pk;
  unsigned char pkey_dig[EVP_MAX_MD_SIZE];
  unsigned int diglen;

  if (strcmp(str, "hash")) {
    return s2i_ASN1_OCTET_STRING(method, ctx, str);
  }

  if (!(oct = ASN1_OCTET_STRING_new())) {
    return NULL;
  }

  if (ctx && (ctx->flags == X509V3_CTX_TEST)) {
    return oct;
  }

  if (!ctx || (!ctx->subject_req && !ctx->subject_cert)) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_NO_PUBLIC_KEY);
    goto err;
  }

  if (ctx->subject_req) {
    pk = ctx->subject_req->req_info->pubkey->public_key;
  } else {
    pk = ctx->subject_cert->cert_info->key->public_key;
  }

  if (!pk) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_NO_PUBLIC_KEY);
    goto err;
  }

  if (!EVP_Digest(pk->data, pk->length, pkey_dig, &diglen, EVP_sha1(), NULL)) {
    goto err;
  }

  if (!ASN1_OCTET_STRING_set(oct, pkey_dig, diglen)) {
    goto err;
  }

  return oct;

err:
  ASN1_OCTET_STRING_free(oct);
  return NULL;
}